

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::DiffuseAreaLight::PDF_Le
          (DiffuseAreaLight *this,Interaction *intr,Vector3f *w,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  ulong uVar2;
  uint uVar3;
  float *pfVar4;
  Curve *this_00;
  undefined1 auVar5 [16];
  float fVar6;
  Float FVar7;
  undefined1 auVar8 [16];
  Normal3f va;
  Tuple3<pbrt::Normal3,_float> local_38;
  
  va.super_Tuple3<pbrt::Normal3,_float>.z = (intr->n).super_Tuple3<pbrt::Normal3,_float>.z;
  va.super_Tuple3<pbrt::Normal3,_float>.x = (intr->n).super_Tuple3<pbrt::Normal3,_float>.x;
  va.super_Tuple3<pbrt::Normal3,_float>.y = (intr->n).super_Tuple3<pbrt::Normal3,_float>.y;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  if (va.super_Tuple3<pbrt::Normal3,_float>.x == 0.0) {
    if ((((va.super_Tuple3<pbrt::Normal3,_float>.y == 0.0) &&
         (!NAN(va.super_Tuple3<pbrt::Normal3,_float>.y))) &&
        (va.super_Tuple3<pbrt::Normal3,_float>.z == 0.0)) &&
       (!NAN(va.super_Tuple3<pbrt::Normal3,_float>.z))) {
      LogFatal<char_const(&)[7],char_const(&)[18],char_const(&)[7],pbrt::Normal3<float>&,char_const(&)[18],pbrt::Normal3<float>&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x2c6,"Check failed: %s != %s with %s = %s, %s = %s",(char (*) [7])"intr.n",
                 (char (*) [18])0x61aaad,(char (*) [7])"intr.n",&va,(char (*) [18])0x61aaad,
                 (Normal3<float> *)&local_38);
    }
  }
  uVar2 = (this->shape).
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          .bits;
  uVar3 = (uint)(ushort)(uVar2 >> 0x30);
  if (uVar2 >> 0x32 == 0) {
    pfVar4 = (float *)(uVar2 & 0xffffffffffff);
    if (uVar2 >> 0x31 == 0) {
      fVar6 = pfVar4[5] * *pfVar4 * (pfVar4[2] - pfVar4[1]);
    }
    else if (uVar3 == 2) {
      fVar6 = (pfVar4[7] - pfVar4[6]) * pfVar4[5] * pfVar4[8];
    }
    else {
      fVar6 = (float)*(undefined8 *)(pfVar4 + 6);
      fVar1 = (float)((ulong)*(undefined8 *)(pfVar4 + 6) >> 0x20);
      auVar5._0_4_ = fVar6 * fVar6;
      auVar5._4_4_ = fVar1 * fVar1;
      auVar5._8_8_ = 0;
      auVar5 = vhsubps_avx(auVar5,auVar5);
      fVar6 = pfVar4[8] * 0.5 * auVar5._0_4_;
    }
  }
  else {
    uVar3 = uVar3 - 3;
    this_00 = (Curve *)(uVar2 & 0xffffffffffff);
    if (1 < uVar3) {
      if (uVar3 == 2) {
        FVar7 = BilinearPatch::PDF((BilinearPatch *)this_00,intr);
      }
      else {
        FVar7 = Curve::PDF(this_00,intr);
      }
      goto LAB_003b6bbd;
    }
    fVar6 = Triangle::Area((Triangle *)this_00);
  }
  FVar7 = 1.0 / fVar6;
LAB_003b6bbd:
  *pdfPos = FVar7;
  fVar6 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.z;
  fVar1 = (w->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar8 = ZEXT416((uint)(fVar6 * fVar1));
  auVar5 = vfmadd132ss_fma(ZEXT416((uint)(intr->n).super_Tuple3<pbrt::Normal3,_float>.y),auVar8,
                           ZEXT416((uint)(w->super_Tuple3<pbrt::Vector3,_float>).y));
  auVar8 = vfmsub213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar6),auVar8);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ + auVar8._0_4_)),
                           ZEXT416((uint)(intr->n).super_Tuple3<pbrt::Normal3,_float>.x),
                           ZEXT416((uint)(w->super_Tuple3<pbrt::Vector3,_float>).x));
  if (this->twoSided == true) {
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(auVar5,auVar8);
    fVar6 = auVar5._0_4_ * 0.31830987 * 0.5;
  }
  else {
    fVar6 = auVar5._0_4_ * 0.31830987;
  }
  *pdfDir = fVar6;
  return;
}

Assistant:

void DiffuseAreaLight::PDF_Le(const Interaction &intr, Vector3f &w, Float *pdfPos,
                              Float *pdfDir) const {
    CHECK_NE(intr.n, Normal3f(0, 0, 0));
    *pdfPos = shape.PDF(intr);
    *pdfDir = twoSided ? (.5 * CosineHemispherePDF(AbsDot(intr.n, w)))
                       : CosineHemispherePDF(Dot(intr.n, w));
}